

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_Error tt_face_build_cmaps(TT_Face face)

{
  FT_Byte *pFVar1;
  ulong uVar2;
  TT_CMap_Class clazz_00;
  uint uVar3;
  int iVar4;
  FT_Error FVar5;
  TT_CMap_Class *in_RAX;
  FT_CMap base;
  FT_Byte *p;
  FT_UInt num_cmaps;
  TT_CMap_Class *pclazz;
  FT_Byte *cmap;
  FT_Error error;
  TT_CMap_Class clazz;
  FT_UInt format;
  FT_CharMapRec charmap;
  FT_CMap ttcmap;
  TT_ValidatorRec valid;
  FT_Byte *local_168;
  uint local_15c;
  TT_CMap_Class *local_158;
  FT_Encoding local_144;
  FT_CharMapRec_ local_130;
  FT_CMap_conflict local_120;
  FT_ValidatorRec_ local_118;
  uint local_38;
  
  pFVar1 = face->cmap_table;
  if ((pFVar1 != (FT_Byte *)0x0) && (uVar2 = face->cmap_size, 3 < uVar2)) {
    in_RAX = (TT_CMap_Class *)((ulong)pFVar1[2] << 8);
    local_15c = (uint)pFVar1[3] | (uint)in_RAX;
    if (local_15c != 0) {
      local_168 = pFVar1 + 4;
      do {
        in_RAX = (TT_CMap_Class *)(local_168 + 8);
        if (pFVar1 + uVar2 < in_RAX) break;
        local_130.platform_id = CONCAT11(*local_168,local_168[1]);
        local_130.encoding_id = CONCAT11(local_168[2],local_168[3]);
        local_130.encoding = FT_ENCODING_NONE;
        uVar3 = (uint)local_168[7] |
                (uint)local_168[6] << 8 | (uint)local_168[5] << 0x10 | (uint)local_168[4] << 0x18;
        local_158 = (TT_CMap_Class *)(ulong)uVar3;
        if ((uVar3 != 0) &&
           (local_158 = (TT_CMap_Class *)(ulong)uVar3,
           local_158 <= (TT_CMap_Class *)(face->cmap_size - 2))) {
          base = (FT_CMap)((long)local_158 + (long)pFVar1);
          for (local_158 = tt_cmap_classes; *local_158 != (TT_CMap_Class)0x0;
              local_158 = local_158 + 1) {
            clazz_00 = *local_158;
            if (clazz_00->format ==
                (uint)CONCAT11(*(undefined1 *)&(base->charmap).face,
                               *(undefined1 *)((long)&(base->charmap).face + 1))) {
              local_144 = FT_ENCODING_NONE;
              local_130.face = &face->root;
              ft_validator_init(&local_118,(FT_Byte *)base,pFVar1 + uVar2,FT_VALIDATE_DEFAULT);
              local_38 = (uint)(face->max_profile).numGlyphs;
              iVar4 = _setjmp((__jmp_buf_tag *)&local_118);
              if (iVar4 == 0) {
                local_144 = (*clazz_00->validate)(base,&local_118);
              }
              if ((local_118.error == 0) &&
                 (FVar5 = FT_CMap_New(&clazz_00->clazz,base,&local_130,&local_120), FVar5 == 0)) {
                local_120[1].charmap.encoding = local_144;
              }
              break;
            }
          }
        }
        local_15c = local_15c - 1;
        in_RAX = local_158;
        local_168 = local_168 + 8;
      } while (local_15c != 0);
    }
  }
  return (FT_Error)in_RAX;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_build_cmaps( TT_Face  face )
  {
    FT_Byte* const     table   = face->cmap_table;
    FT_Byte*           limit;
    FT_UInt volatile   num_cmaps;
    FT_Byte* volatile  p       = table;
    FT_Library         library = FT_FACE_LIBRARY( face );

    FT_UNUSED( library );


    if ( !p || face->cmap_size < 4 )
      return FT_THROW( Invalid_Table );

    /* Version 1.8.3 of the OpenType specification contains the following */
    /* (https://docs.microsoft.com/en-us/typography/opentype/spec/cmap):  */
    /*                                                                    */
    /*   The 'cmap' table version number remains at 0x0000 for fonts that */
    /*   make use of the newer subtable formats.                          */
    /*                                                                    */
    /* This essentially means that a version format test is useless.      */

    /* ignore format */
    p += 2;

    num_cmaps = TT_NEXT_USHORT( p );
    FT_TRACE4(( "tt_face_build_cmaps: %d cmaps\n", num_cmaps ));

    limit = table + face->cmap_size;
    for ( ; num_cmaps > 0 && p + 8 <= limit; num_cmaps-- )
    {
      FT_CharMapRec  charmap;
      FT_UInt32      offset;


      charmap.platform_id = TT_NEXT_USHORT( p );
      charmap.encoding_id = TT_NEXT_USHORT( p );
      charmap.face        = FT_FACE( face );
      charmap.encoding    = FT_ENCODING_NONE;  /* will be filled later */
      offset              = TT_NEXT_ULONG( p );

      if ( offset && offset <= face->cmap_size - 2 )
      {
        FT_Byte* volatile              cmap   = table + offset;
        volatile FT_UInt               format = TT_PEEK_USHORT( cmap );
        const TT_CMap_Class* volatile  pclazz = tt_cmap_classes;
        TT_CMap_Class volatile         clazz;


        for ( ; *pclazz; pclazz++ )
        {
          clazz = *pclazz;
          if ( clazz->format == format )
          {
            volatile TT_ValidatorRec  valid;
            volatile FT_Error         error = FT_Err_Ok;


            ft_validator_init( FT_VALIDATOR( &valid ), cmap, limit,
                               FT_VALIDATE_DEFAULT );

            valid.num_glyphs = (FT_UInt)face->max_profile.numGlyphs;

            if ( ft_setjmp( FT_VALIDATOR( &valid )->jump_buffer) == 0 )
            {
              /* validate this cmap sub-table */
              error = clazz->validate( cmap, FT_VALIDATOR( &valid ) );
            }

            if ( !valid.validator.error )
            {
              FT_CMap  ttcmap;


              /* It might make sense to store the single variation         */
              /* selector cmap somewhere special.  But it would have to be */
              /* in the public FT_FaceRec, and we can't change that.       */

              if ( !FT_CMap_New( (FT_CMap_Class)clazz,
                                 cmap, &charmap, &ttcmap ) )
              {
                /* it is simpler to directly set `flags' than adding */
                /* a parameter to FT_CMap_New                        */
                ((TT_CMap)ttcmap)->flags = (FT_Int)error;
              }
            }
            else
            {
              FT_TRACE0(( "tt_face_build_cmaps:"
                          " broken cmap sub-table ignored\n" ));
            }
            break;
          }
        }

        if ( !*pclazz )
        {
          FT_TRACE0(( "tt_face_build_cmaps:"
                      " unsupported cmap sub-table ignored\n" ));
        }
      }
    }

    return FT_Err_Ok;
  }